

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_color.cpp
# Opt level: O1

void __thiscall Prog::Prog(Prog *this,Theme *theme,ALLEGRO_DISPLAY *display)

{
  long lVar1;
  uint uVar2;
  int grid_x;
  long lVar3;
  Label *pLVar4;
  char *__end;
  long lVar5;
  char **local_e8;
  long local_e0;
  string local_d0;
  string local_b0;
  string local_90;
  VSlider local_70;
  
  Dialog::Dialog(&this->d,theme,display,0x280,0x1e0);
  lVar3 = 0x68;
  do {
    VSlider::VSlider((VSlider *)((long)&(this->d).theme + lVar3),0,1);
    lVar3 = lVar3 + 0x40;
  } while (lVar3 != 0x528);
  pLVar4 = (Label *)&this->field_0x528;
  lVar3 = 0;
  do {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"","");
    Label::Label(pLVar4,&local_90,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    lVar3 = lVar3 + -0x60;
    pLVar4 = pLVar4 + 1;
  } while (lVar3 != -0x720);
  pLVar4 = (Label *)&this->field_0xc48;
  lVar3 = 0;
  do {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"","");
    Label::Label(pLVar4,&local_b0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    lVar3 = lVar3 + -0x60;
    pLVar4 = pLVar4 + 1;
  } while (lVar3 != -0x720);
  lVar3 = 0x4da;
  lVar5 = 0x528;
  local_e8 = names;
  local_e0 = 0x68;
  lVar1 = 0;
  do {
    if (lVar3 - 0x4daU < 0xc) {
      uVar2 = ((int)lVar3 - 0x4daU) / 3;
    }
    else {
      uVar2 = 5 - (lVar3 - 0x4daU < 0x10);
    }
    VSlider::VSlider(&local_70,1000,1000);
    *(ulong *)(&this->field_0x89 + lVar1 * 2) =
         CONCAT17((undefined1)local_70.super_Widget.x2,local_70.super_Widget._33_7_);
    *(undefined8 *)((long)(&this->field_0x89 + lVar1 * 2) + 8) = local_70.super_Widget._41_8_;
    *(Dialog **)(&this->field_0x80 + lVar1 * 2) = local_70.super_Widget.dialog;
    *(ulong *)((long)(&this->field_0x80 + lVar1 * 2) + 8) =
         CONCAT71(local_70.super_Widget._33_7_,(undefined1)local_70.super_Widget.x1);
    *(undefined8 *)(&this->field_0x70 + lVar1 * 2) = local_70.super_Widget._8_8_;
    *(undefined8 *)((long)(&this->field_0x70 + lVar1 * 2) + 8) = local_70.super_Widget._16_8_;
    *(undefined8 *)(&this->field_0x9c + lVar1 * 2) = local_70._52_8_;
    Dialog::add(&this->d,(Widget *)((long)&(this->d).theme + local_e0),uVar2 * 0x10 + (int)lVar1 + 8
                ,8,0xf,0x100);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,*local_e8,(allocator<char> *)&local_70);
    pLVar4 = (Label *)((long)&(this->d).theme + lVar5);
    Label::set_text(pLVar4,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    grid_x = uVar2 * 0x10 + (int)lVar1;
    Dialog::add(&this->d,(Widget *)pLVar4,grid_x,0x108,0x20,0x14);
    Dialog::add(&this->d,(Widget *)(&this->field_0x720 + lVar5),grid_x,0x11c,0x20,0x14);
    *(undefined4 *)((long)&(this->d).theme + lVar3 * 4) = 0;
    lVar3 = lVar3 + 1;
    lVar5 = lVar5 + 0x60;
    local_e8 = local_e8 + 1;
    lVar1 = lVar1 + 0x20;
    local_e0 = local_e0 + 0x40;
  } while (lVar3 != 0x4ed);
  return;
}

Assistant:

Prog::Prog(const Theme & theme, ALLEGRO_DISPLAY *display) :
   d(Dialog(theme, display, 640, 480))
{
   for (int i = 0; i < SLIDERS_COUNT; i++) {
      int j = i < 12 ? i / 3 : i < 16 ? 4 : 5;
      sliders[i] = VSlider(1000, 1000);
      d.add(sliders[i], 8 + i * 32 + j * 16, 8, 15, 256);
      labels[i].set_text(names[i]);
      d.add(labels[i], i * 32 + j * 16, 8 + 256, 32, 20);
      d.add(labels2[i], i * 32 + j * 16, 8 + 276, 32, 20);
      previous[i] = 0;
   }
}